

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void getTime(xmlTime *time)

{
  undefined1 local_20 [8];
  timeval tv;
  xmlTime *time_local;
  
  tv.tv_usec = (__suseconds_t)time;
  gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  *(undefined1 (*) [8])tv.tv_usec = local_20;
  *(undefined4 *)(tv.tv_usec + 8) = (undefined4)tv.tv_sec;
  return;
}

Assistant:

static void
getTime(xmlTime *time) {
#ifdef _WIN32
    struct __timeb64 timebuffer;

    _ftime64(&timebuffer);
    time->sec = timebuffer.time;
    time->usec = timebuffer.millitm * 1000;
#else /* _WIN32 */
    struct timeval tv;

    gettimeofday(&tv, NULL);
    time->sec = tv.tv_sec;
    time->usec = tv.tv_usec;
#endif /* _WIN32 */
}